

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O1

int __thiscall ncnn::MemoryData::load_model(MemoryData *this,ModelBin *mb)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  void *local_68;
  int *piStack_60;
  size_t local_58;
  int local_50;
  Allocator *local_48;
  int local_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  int local_30;
  size_t local_28;
  
  if (this->c == 0) {
    if (this->h == 0) {
      if (this->w == 0) {
        Mat::create(&this->data,1,4,(Allocator *)0x0);
        goto LAB_001f78dc;
      }
      (*mb->_vptr_ModelBin[2])(&local_68);
      if (&this->data != (Mat *)&local_68) {
        if (piStack_60 != (int *)0x0) {
          LOCK();
          *piStack_60 = *piStack_60 + 1;
          UNLOCK();
        }
        piVar1 = (this->data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = (this->data).data;
            pAVar3 = (this->data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->data).cstep = 0;
        *(undefined8 *)((long)&(this->data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->data).elemsize + 4) = 0;
        (this->data).data = (void *)0x0;
        (this->data).refcount = (int *)0x0;
        (this->data).dims = 0;
        (this->data).w = 0;
        (this->data).h = 0;
        (this->data).d = 0;
        (this->data).c = 0;
        (this->data).data = local_68;
        (this->data).refcount = piStack_60;
        (this->data).elemsize = local_58;
        (this->data).elempack = local_50;
        (this->data).allocator = local_48;
        (this->data).dims = local_40;
        (this->data).w = iStack_3c;
        (this->data).h = iStack_38;
        (this->data).d = iStack_34;
        (this->data).c = local_30;
        (this->data).cstep = local_28;
      }
      if (piStack_60 == (int *)0x0) goto LAB_001f78dc;
      LOCK();
      *piStack_60 = *piStack_60 + -1;
      UNLOCK();
      if (*piStack_60 != 0) goto LAB_001f78dc;
      if (local_48 != (Allocator *)0x0) {
        (*local_48->_vptr_Allocator[3])();
        goto LAB_001f78dc;
      }
    }
    else {
      (*mb->_vptr_ModelBin[3])(&local_68,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,1);
      if (&this->data != (Mat *)&local_68) {
        if (piStack_60 != (int *)0x0) {
          LOCK();
          *piStack_60 = *piStack_60 + 1;
          UNLOCK();
        }
        piVar1 = (this->data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = (this->data).data;
            pAVar3 = (this->data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->data).cstep = 0;
        *(undefined8 *)((long)&(this->data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->data).elemsize + 4) = 0;
        (this->data).data = (void *)0x0;
        (this->data).refcount = (int *)0x0;
        (this->data).dims = 0;
        (this->data).w = 0;
        (this->data).h = 0;
        (this->data).d = 0;
        (this->data).c = 0;
        (this->data).data = local_68;
        (this->data).refcount = piStack_60;
        (this->data).elemsize = local_58;
        (this->data).elempack = local_50;
        (this->data).allocator = local_48;
        (this->data).dims = local_40;
        (this->data).w = iStack_3c;
        (this->data).h = iStack_38;
        (this->data).d = iStack_34;
        (this->data).c = local_30;
        (this->data).cstep = local_28;
      }
      if (piStack_60 == (int *)0x0) goto LAB_001f78dc;
      LOCK();
      *piStack_60 = *piStack_60 + -1;
      UNLOCK();
      if (*piStack_60 != 0) goto LAB_001f78dc;
      if (local_48 != (Allocator *)0x0) {
        (*local_48->_vptr_Allocator[3])();
        goto LAB_001f78dc;
      }
    }
  }
  else {
    (*mb->_vptr_ModelBin[4])
              (&local_68,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,(ulong)(uint)this->c,1);
    if (&this->data != (Mat *)&local_68) {
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + 1;
        UNLOCK();
      }
      piVar1 = (this->data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = (this->data).data;
          pAVar3 = (this->data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      (this->data).cstep = 0;
      *(undefined8 *)((long)&(this->data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->data).elemsize + 4) = 0;
      (this->data).data = (void *)0x0;
      (this->data).refcount = (int *)0x0;
      (this->data).dims = 0;
      (this->data).w = 0;
      (this->data).h = 0;
      (this->data).d = 0;
      (this->data).c = 0;
      (this->data).data = local_68;
      (this->data).refcount = piStack_60;
      (this->data).elemsize = local_58;
      (this->data).elempack = local_50;
      (this->data).allocator = local_48;
      (this->data).dims = local_40;
      (this->data).w = iStack_3c;
      (this->data).h = iStack_38;
      (this->data).d = iStack_34;
      (this->data).c = local_30;
      (this->data).cstep = local_28;
    }
    if (piStack_60 == (int *)0x0) goto LAB_001f78dc;
    LOCK();
    *piStack_60 = *piStack_60 + -1;
    UNLOCK();
    if (*piStack_60 != 0) goto LAB_001f78dc;
    if (local_48 != (Allocator *)0x0) {
      (*local_48->_vptr_Allocator[3])();
      goto LAB_001f78dc;
    }
  }
  if (local_68 != (void *)0x0) {
    free(local_68);
  }
LAB_001f78dc:
  if ((this->data).data == (void *)0x0) {
    iVar4 = -100;
  }
  else {
    iVar4 = -100;
    if ((long)(this->data).c * (this->data).cstep != 0) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int MemoryData::load_model(const ModelBin& mb)
{
    if (c != 0)
    {
        data = mb.load(w, h, c, 1);
    }
    else if (h != 0)
    {
        data = mb.load(w, h, 1);
    }
    else if (w != 0)
    {
        data = mb.load(w, 1);
    }
    else // 0 0 0
    {
        data.create(1);
    }
    if (data.empty())
        return -100;

    return 0;
}